

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O1

compile_errcode __thiscall CompoundStatement::Generate(CompoundStatement *this)

{
  SymbolName SVar1;
  
  SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
  if (SVar1 == CONST_SYM) {
    ConstantDeclaration::Generate(&this->m_constant_declaration);
  }
  VariableDeclaration::Generate(&this->m_variable_declaration);
  StatementList::Generate(&this->m_statement_list);
  return 0;
}

Assistant:

compile_errcode CompoundStatement::Generate() {
    int ret = COMPILE_OK;
    SymbolName name = handle_correct_queue->GetCurrentName();
    if (name == CONST_SYM) {
        if ((ret = m_constant_declaration.Generate()) == COMPILE_OK) {
        }
    }
    if ((ret = m_variable_declaration.Generate()) == COMPILE_OK) {
    }
    m_statement_list.Generate();
    return COMPILE_OK;
}